

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_globals.cpp
# Opt level: O1

void __thiscall
megumax::SearchGlobals::SearchGlobals
          (SearchGlobals *this,uint64_t nodes,
          optional<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> start_time,
          optional<libchess::UCIGoParameters> *go_parameters)

{
  undefined8 uVar1;
  long lVar2;
  optional<libchess::UCIGoParameters> *poVar3;
  optional<libchess::UCIGoParameters> *poVar4;
  byte bVar5;
  
  bVar5 = 0;
  *(undefined8 *)((long)&(this->debug_mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->debug_mutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->debug_mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->debug_mutex).super___mutex_base._M_mutex + 8) = 0;
  (this->debug_mutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable(&this->debug_cv);
  (this->side_to_move_).super_MetaValueType<int>.value_ = 0;
  this->searching_ = (__atomic_base<bool>)0x0;
  this->stop_flag_ = (__atomic_base<bool>)0x0;
  (this->nodes_).super___atomic_base<unsigned_long>._M_i = nodes;
  (this->start_time_).
  super__Optional_base<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_true,_true>._M_payload.
  super__Optional_payload_base<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>._M_payload =
       start_time.
       super__Optional_base<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_true,_true>.
       _M_payload.super__Optional_payload_base<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>
       ._M_payload;
  (this->start_time_).
  super__Optional_base<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_true,_true>._M_payload.
  super__Optional_payload_base<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>._M_engaged =
       start_time.
       super__Optional_base<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_true,_true>.
       _M_payload.super__Optional_payload_base<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>
       ._M_engaged;
  (this->go_parameters_).super__Optional_base<libchess::UCIGoParameters,_false,_false>._M_payload.
  super__Optional_payload<libchess::UCIGoParameters,_true,_false,_false>.
  super__Optional_payload_base<libchess::UCIGoParameters>._M_engaged = false;
  if ((go_parameters->super__Optional_base<libchess::UCIGoParameters,_false,_false>)._M_payload.
      super__Optional_payload<libchess::UCIGoParameters,_true,_false,_false>.
      super__Optional_payload_base<libchess::UCIGoParameters>._M_engaged == true) {
    poVar3 = go_parameters;
    poVar4 = &this->go_parameters_;
    for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
      *(undefined8 *)
       &(poVar4->super__Optional_base<libchess::UCIGoParameters,_false,_false>)._M_payload.
        super__Optional_payload<libchess::UCIGoParameters,_true,_false,_false>.
        super__Optional_payload_base<libchess::UCIGoParameters>._M_payload._M_value.nodes_.
        super__Optional_base<unsigned_long,_true,_true> =
           *(undefined8 *)
            &(poVar3->super__Optional_base<libchess::UCIGoParameters,_false,_false>)._M_payload.
             super__Optional_payload<libchess::UCIGoParameters,_true,_false,_false>.
             super__Optional_payload_base<libchess::UCIGoParameters>._M_payload._M_value.nodes_.
             super__Optional_base<unsigned_long,_true,_true>;
      poVar3 = (optional<libchess::UCIGoParameters> *)((long)poVar3 + (ulong)bVar5 * -0x10 + 8);
      poVar4 = (optional<libchess::UCIGoParameters> *)((long)poVar4 + (ulong)bVar5 * -0x10 + 8);
    }
    *(undefined2 *)
     ((long)&(this->go_parameters_).super__Optional_base<libchess::UCIGoParameters,_false,_false>.
             _M_payload.super__Optional_payload<libchess::UCIGoParameters,_true,_false,_false>.
             super__Optional_payload_base<libchess::UCIGoParameters>._M_payload + 0x48) =
         *(undefined2 *)
          ((long)&(go_parameters->super__Optional_base<libchess::UCIGoParameters,_false,_false>).
                  _M_payload.super__Optional_payload<libchess::UCIGoParameters,_true,_false,_false>.
                  super__Optional_payload_base<libchess::UCIGoParameters>._M_payload + 0x48);
    *(undefined1 *)
     ((long)&(this->go_parameters_).super__Optional_base<libchess::UCIGoParameters,_false,_false>.
             _M_payload.super__Optional_payload<libchess::UCIGoParameters,_true,_false,_false>.
             super__Optional_payload_base<libchess::UCIGoParameters>._M_payload + 0x68) = 0;
    if (*(char *)((long)&(go_parameters->
                         super__Optional_base<libchess::UCIGoParameters,_false,_false>)._M_payload.
                         super__Optional_payload<libchess::UCIGoParameters,_true,_false,_false>.
                         super__Optional_payload_base<libchess::UCIGoParameters>._M_payload + 0x68)
        == '\x01') {
      uVar1 = *(undefined8 *)
               ((long)&(go_parameters->super__Optional_base<libchess::UCIGoParameters,_false,_false>
                       )._M_payload.
                       super__Optional_payload<libchess::UCIGoParameters,_true,_false,_false>.
                       super__Optional_payload_base<libchess::UCIGoParameters>._M_payload + 0x58);
      *(undefined8 *)
       ((long)&(this->go_parameters_).super__Optional_base<libchess::UCIGoParameters,_false,_false>.
               _M_payload.super__Optional_payload<libchess::UCIGoParameters,_true,_false,_false>.
               super__Optional_payload_base<libchess::UCIGoParameters>._M_payload + 0x50) =
           *(undefined8 *)
            ((long)&(go_parameters->super__Optional_base<libchess::UCIGoParameters,_false,_false>).
                    _M_payload.
                    super__Optional_payload<libchess::UCIGoParameters,_true,_false,_false>.
                    super__Optional_payload_base<libchess::UCIGoParameters>._M_payload + 0x50);
      *(undefined8 *)
       ((long)&(this->go_parameters_).super__Optional_base<libchess::UCIGoParameters,_false,_false>.
               _M_payload.super__Optional_payload<libchess::UCIGoParameters,_true,_false,_false>.
               super__Optional_payload_base<libchess::UCIGoParameters>._M_payload + 0x58) = uVar1;
      *(undefined8 *)
       ((long)&(this->go_parameters_).super__Optional_base<libchess::UCIGoParameters,_false,_false>.
               _M_payload.super__Optional_payload<libchess::UCIGoParameters,_true,_false,_false>.
               super__Optional_payload_base<libchess::UCIGoParameters>._M_payload + 0x60) =
           *(undefined8 *)
            ((long)&(go_parameters->super__Optional_base<libchess::UCIGoParameters,_false,_false>).
                    _M_payload.
                    super__Optional_payload<libchess::UCIGoParameters,_true,_false,_false>.
                    super__Optional_payload_base<libchess::UCIGoParameters>._M_payload + 0x60);
      *(undefined8 *)
       ((long)&(go_parameters->super__Optional_base<libchess::UCIGoParameters,_false,_false>).
               _M_payload.super__Optional_payload<libchess::UCIGoParameters,_true,_false,_false>.
               super__Optional_payload_base<libchess::UCIGoParameters>._M_payload + 0x50) = 0;
      *(undefined8 *)
       ((long)&(go_parameters->super__Optional_base<libchess::UCIGoParameters,_false,_false>).
               _M_payload.super__Optional_payload<libchess::UCIGoParameters,_true,_false,_false>.
               super__Optional_payload_base<libchess::UCIGoParameters>._M_payload + 0x58) = 0;
      *(undefined8 *)
       ((long)&(go_parameters->super__Optional_base<libchess::UCIGoParameters,_false,_false>).
               _M_payload.super__Optional_payload<libchess::UCIGoParameters,_true,_false,_false>.
               super__Optional_payload_base<libchess::UCIGoParameters>._M_payload + 0x60) = 0;
      *(undefined1 *)
       ((long)&(this->go_parameters_).super__Optional_base<libchess::UCIGoParameters,_false,_false>.
               _M_payload.super__Optional_payload<libchess::UCIGoParameters,_true,_false,_false>.
               super__Optional_payload_base<libchess::UCIGoParameters>._M_payload + 0x68) = 1;
    }
    (this->go_parameters_).super__Optional_base<libchess::UCIGoParameters,_false,_false>._M_payload.
    super__Optional_payload<libchess::UCIGoParameters,_true,_false,_false>.
    super__Optional_payload_base<libchess::UCIGoParameters>._M_engaged = true;
  }
  this->debug_ = false;
  return;
}

Assistant:

SearchGlobals::SearchGlobals(std::uint64_t nodes,
                             std::optional<std::chrono::milliseconds> start_time,
                             std::optional<libchess::UCIGoParameters> go_parameters) noexcept
    : debug_mutex(),
      debug_cv(),
      side_to_move_(libchess::constants::WHITE),
      searching_(false),
      stop_flag_(false),
      nodes_(nodes),
      start_time_(start_time),
      go_parameters_(std::move(go_parameters)),
      debug_(false) {
}